

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_graph_quantity.cpp
# Opt level: O2

void __thiscall polyscope::SurfaceGraphQuantity::buildCustomUI(SurfaceGraphQuantity *this)

{
  vec3 newColor;
  bool bVar1;
  
  ImGui::SameLine(0.0,-1.0);
  bVar1 = ImGui::ColorEdit3("Color",(float *)&(this->color).value,0x20);
  if (bVar1) {
    newColor.field_0 = (this->color).value.field_0;
    newColor.field_1 = (this->color).value.field_1;
    newColor.field_2 = (this->color).value.field_2;
    setColor(this,newColor);
  }
  ImGui::Text("Nodes: %lu  Edges: %lu",
              ((long)(this->nodes).
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->nodes).
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc,
              (long)(this->edges).
                    super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->edges).
                    super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
  bVar1 = ImGui::SliderFloat("Radius",&(this->radius).value.value,0.0,0.1,"%.5f",3.0);
  if (bVar1) {
    PersistentValue<polyscope::ScaledValue<float>_>::manuallyChanged(&this->radius);
    requestRedraw();
    return;
  }
  return;
}

Assistant:

void SurfaceGraphQuantity::buildCustomUI() {
  ImGui::SameLine();
  if (ImGui::ColorEdit3("Color", &color.get()[0], ImGuiColorEditFlags_NoInputs)) setColor(getColor());
  ImGui::Text("Nodes: %lu  Edges: %lu", nodes.size(), edges.size());
  if (ImGui::SliderFloat("Radius", radius.get().getValuePtr(), 0.0, .1, "%.5f", 3.)) {
    radius.manuallyChanged();
    requestRedraw();
  }
}